

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexReader::readMetaDataBlock
          (PtexReader *this,MetaData *metadata,FilePos pos,int zipsize,int memsize,
          size_t *metaDataMemUsed)

{
  byte *pbVar1;
  byte bVar2;
  byte datatype;
  uint datasize;
  int zipsize_00;
  int unzipsize;
  bool bVar3;
  undefined8 in_RAX;
  byte *data;
  byte *pbVar4;
  byte *pbVar5;
  int local_38;
  int local_34;
  
  pbVar4 = (byte *)&local_38;
  local_34 = (int)((ulong)in_RAX >> 0x20);
  _local_38 = CONCAT44(local_34,zipsize);
  seek(this,pos);
  local_34 = memsize;
  if (memsize < 0x4001) {
    pbVar4 = (byte *)((long)&local_38 - ((long)memsize + 0xfU & 0xfffffffffffffff0));
    data = pbVar4;
  }
  else {
    data = (byte *)operator_new__((ulong)(uint)memsize);
  }
  unzipsize = local_34;
  zipsize_00 = local_38;
  pbVar4[-8] = 0x41;
  pbVar4[-7] = 0x44;
  pbVar4[-6] = 0x11;
  pbVar4[-5] = 0;
  pbVar4[-4] = 0;
  pbVar4[-3] = 0;
  pbVar4[-2] = 0;
  pbVar4[-1] = 0;
  bVar3 = readZipBlock(this,data,zipsize_00,unzipsize);
  if (bVar3) {
    for (pbVar5 = data; pbVar5 < data + memsize;
        pbVar5 = pbVar5 + (ulong)datasize + (ulong)bVar2 + 6) {
      bVar2 = *pbVar5;
      pbVar1 = pbVar5 + bVar2;
      *pbVar1 = 0;
      datatype = pbVar1[1];
      datasize = *(uint *)(pbVar1 + 2);
      *(size_t **)(pbVar4 + -0x10) = metaDataMemUsed;
      pbVar4[-0x18] = 0x92;
      pbVar4[-0x17] = 0x44;
      pbVar4[-0x16] = 0x11;
      pbVar4[-0x15] = 0;
      pbVar4[-0x14] = 0;
      pbVar4[-0x13] = 0;
      pbVar4[-0x12] = 0;
      pbVar4[-0x11] = 0;
      MetaData::addEntry(metadata,bVar2 - 1,(char *)(pbVar5 + 1),datatype,datasize,pbVar1 + 6,
                         *(size_t **)(pbVar4 + -0x10));
    }
  }
  if (0x4000 < local_34) {
    pbVar4[-8] = 0xa7;
    pbVar4[-7] = 0x44;
    pbVar4[-6] = 0x11;
    pbVar4[-5] = 0;
    pbVar4[-4] = 0;
    pbVar4[-3] = 0;
    pbVar4[-2] = 0;
    pbVar4[-1] = 0;
    operator_delete__(data);
  }
  return;
}

Assistant:

void PtexReader::readMetaDataBlock(MetaData* metadata, FilePos pos, int zipsize, int memsize, size_t& metaDataMemUsed)
{
    seek(pos);
    // read from file
    bool useNew = memsize > AllocaMax;
    char* buff = useNew ? new char[memsize] : (char*)alloca(memsize);

    if (readZipBlock(buff, zipsize, memsize)) {
        // unpack data entries
        char* ptr = buff;
        char* end = ptr + memsize;
        while (ptr < end) {
            uint8_t keysize = *ptr++;
            char* key = (char*)ptr; ptr += keysize;
            key[keysize-1] = '\0';
            uint8_t datatypeval = *ptr++;
            uint32_t datasize; memcpy(&datasize, ptr, sizeof(datasize));
            ptr += sizeof(datasize);
            char* data = ptr; ptr += datasize;
            metadata->addEntry((uint8_t)(keysize-1), key, datatypeval, datasize, data, metaDataMemUsed);
        }
    }
    if (useNew) delete [] buff;
}